

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

void Imath_3_2::(anonymous_namespace)::jacobiRotateRight<float,0,1>
               (Matrix33<float> *A,float c,float s)

{
  float fVar1;
  float fVar2;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 0x24; lVar3 = lVar3 + 0xc) {
    fVar1 = *(float *)((long)A->x[0] + lVar3);
    fVar2 = *(float *)((long)A->x[0] + lVar3 + 4);
    *(ulong *)((long)A->x[0] + lVar3) = CONCAT44(fVar1 * s + fVar2 * c,fVar1 * c + -fVar2 * s);
  }
  return;
}

Assistant:

void
jacobiRotateRight (
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A, const T c, const T s)
{
    for (int i = 0; i < 3; ++i)
    {
        const T tau1 = A[i][j];
        const T tau2 = A[i][k];
        A[i][j]      = c * tau1 - s * tau2;
        A[i][k]      = s * tau1 + c * tau2;
    }
}